

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_index_tree.cpp
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
duckdb::WindowIndexTree::SelectNth(WindowIndexTree *this,SubFrames *frames,idx_t n)

{
  pointer pMVar1;
  const_reference this_00;
  const_reference pvVar2;
  pointer pMVar3;
  const_reference this_01;
  const_reference pvVar4;
  value_type vVar5;
  unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
  *this_02;
  unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
  *this_03;
  pair<unsigned_long,_unsigned_long> pVar6;
  
  if ((this->super_WindowMergeSortTree).mst32.
      super_unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_*,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>_>
      .
      super__Head_base<0UL,_duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_*,_false>
      ._M_head_impl ==
      (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *)0x0) {
    this_03 = &(this->super_WindowMergeSortTree).mst64;
    pMVar3 = unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
             ::operator->(this_03);
    pVar6 = MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::
            SelectNth(pMVar3,frames,n);
    if (pVar6.second != 0) {
      return pVar6;
    }
    pMVar3 = unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
             ::operator->(this_03);
    this_01 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
              ::front(&pMVar3->tree);
    pvVar4 = vector<unsigned_long,_true>::operator[](&this_01->first,pVar6.first);
    vVar5 = *pvVar4;
  }
  else {
    this_02 = &(this->super_WindowMergeSortTree).mst32;
    pMVar1 = unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
             ::operator->(this_02);
    pVar6 = MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::
            SelectNth(pMVar1,frames,n);
    if (pVar6.second != 0) {
      return pVar6;
    }
    pMVar1 = unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
             ::operator->(this_02);
    this_00 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
              ::front(&pMVar1->tree);
    pvVar2 = vector<unsigned_int,_true>::operator[](&this_00->first,pVar6.first);
    vVar5 = (value_type)*pvVar2;
  }
  pVar6.second = 0;
  pVar6.first = vVar5;
  return pVar6;
}

Assistant:

pair<idx_t, idx_t> WindowIndexTree::SelectNth(const SubFrames &frames, idx_t n) const {
	if (mst32) {
		const auto nth = mst32->SelectNth(frames, n);
		if (nth.second) {
			return nth;
		} else {
			return {mst32->NthElement(nth.first), 0};
		}
	} else {
		const auto nth = mst64->SelectNth(frames, n);
		if (nth.second) {
			return nth;
		} else {
			return {mst64->NthElement(nth.first), 0};
		}
	}
}